

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_flechette.cpp
# Opt level: O0

int AF_A_CheckThrowBomb2(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double *pdVar1;
  bool bVar2;
  double dVar3;
  VMValue *local_b0;
  bool local_a2;
  bool local_9f;
  undefined1 local_88 [8];
  VMValue params [3];
  void *local_48;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_18;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_18 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flechette.cpp"
                  ,0x1ba,"int AF_A_CheckThrowBomb2(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_9f = true;
    if (stateowner != (AActor *)0x0) {
      local_9f = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_9f == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flechette.cpp"
                    ,0x1ba,
                    "int AF_A_CheckThrowBomb2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, pVStack_18[(int)self].field_0.field_1.atag != 1)) {
        bVar2 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flechette.cpp"
                      ,0x1ba,
                      "int AF_A_CheckThrowBomb2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      stateinfo = (FStateParamInfo *)pVStack_18[(int)self].field_0.field_1.a;
      local_a2 = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_a2 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_a2 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flechette.cpp"
                      ,0x1ba,
                      "int AF_A_CheckThrowBomb2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, pVStack_18[(int)self].field_0.field_1.atag != 8)) {
        bVar2 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flechette.cpp"
                      ,0x1ba,
                      "int AF_A_CheckThrowBomb2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      local_48 = pVStack_18[(int)self].field_0.field_1.a;
    }
    else {
      local_48 = (void *)0x0;
    }
    pdVar1 = &(stateowner->Vel).Z;
    if ((*pdVar1 <= 2.0 && *pdVar1 != 2.0) &&
       (dVar3 = TVector3<double>::LengthSquared(&stateowner->Vel), dVar3 < 2.25)) {
      AActor::SetState(stateowner,stateowner->SpawnState + 6,false);
      AActor::SetZ(stateowner,stateowner->floorz,true);
      (stateowner->Vel).Z = 0.0;
      TFlags<ActorBounceFlag,_unsigned_short>::operator=(&stateowner->BounceFlags,BOUNCE_None);
      operator~((EnumType)&stack0xffffffffffffffb4);
      TFlags<ActorFlag,_unsigned_int>::operator&=
                (&stateowner->flags,(Self *)&stack0xffffffffffffffb4);
    }
    VMValue::VMValue((VMValue *)local_88,(DObject *)stateowner);
    VMValue::VMValue((VMValue *)((long)&params[0].field_0 + 8),(DObject *)stateowner);
    VMValue::VMValue((VMValue *)((long)&params[1].field_0 + 8),(void *)0x0,8);
    VMFrameStack::Call((VMFrameStack *)param_local,&A_CheckThrowBomb_VMPtr->super_VMFunction,
                       (VMValue *)local_88,3,(VMReturn *)0x0,0,(VMException **)0x0);
    local_b0 = (VMValue *)((long)&params[2].field_0 + 8);
    do {
      local_b0 = local_b0 + -1;
      VMValue::~VMValue(local_b0);
    } while (local_b0 != (VMValue *)local_88);
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flechette.cpp"
                ,0x1ba,"int AF_A_CheckThrowBomb2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CheckThrowBomb2)
{
	PARAM_ACTION_PROLOGUE;

	// [RH] Check using actual velocity, although the vel.z < 2 check still stands
	if (self->Vel.Z < 2 && self->Vel.LengthSquared() < (9./4.))
	{
		self->SetState (self->SpawnState + 6);
		self->SetZ(self->floorz);
		self->Vel.Z = 0;
		self->BounceFlags = BOUNCE_None;
		self->flags &= ~MF_MISSILE;
	}
	CALL_ACTION(A_CheckThrowBomb, self);
	return 0;
}